

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O2

void __thiscall llbuild::basic::StringList::StringList(StringList *this,StringRef value)

{
  char *__dest;
  void *pvVar1;
  size_t __n;
  char *__s;
  
  __n = value.Length;
  __s = value.Data;
  this->size = __n + 1;
  __dest = (char *)operator_new__(__n + 1);
  this->contents = __dest;
  if (__n != 0) {
    pvVar1 = memchr(__s,0,__n);
    if ((long)pvVar1 - (long)__s != -1 && pvVar1 != (void *)0x0) {
      __assert_fail("value.find(\'\\0\') == StringRef::npos",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                    ,0x31,"llbuild::basic::StringList::StringList(StringRef)");
    }
  }
  memcpy(__dest,__s,__n);
  __dest[__n] = '\0';
  return;
}

Assistant:

explicit StringList(StringRef value) {
    size = value.size() + 1;
    contents = new char[size];
    assert(value.find('\0') == StringRef::npos);
    memcpy(contents, value.data(), value.size());
    contents[size - 1] = '\0';
  }